

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::wheelEvent(QListView *this,QWheelEvent *e)

{
  int iVar1;
  int iVar2;
  MouseButtons MVar3;
  QFlagsStorage<Qt::KeyboardModifier> QVar4;
  ScrollPhase SVar5;
  MouseEventSource MVar6;
  QListViewPrivate *pQVar7;
  QPointingDevice *pQVar8;
  QWheelEvent *in_RSI;
  long in_FS_OFFSET;
  bool bVar9;
  QListViewPrivate *d;
  QWheelEvent hwe;
  QPoint angleDelta;
  QPoint pixelDelta;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined1 local_100 [24];
  QPoint *local_e8;
  QPoint *local_e0;
  QPointF local_d8;
  QPointF local_c8;
  QWheelEvent local_b8 [96];
  QPoint local_58;
  QPoint local_50;
  QPoint *local_48;
  QPoint local_40;
  QPoint local_38;
  QPoint *local_30;
  QPoint local_28;
  QPoint local_20;
  int local_18;
  QPoint local_14;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = d_func((QListView *)0x878ad0);
  local_14 = QWheelEvent::angleDelta
                       ((QWheelEvent *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
                       );
  local_c = QPoint::y((QPoint *)0x878af4);
  iVar1 = qAbs<int>(&local_c);
  local_20 = QWheelEvent::angleDelta
                       ((QWheelEvent *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
                       );
  local_18 = QPoint::x((QPoint *)0x878b2b);
  iVar2 = qAbs<int>(&local_18);
  if (iVar2 < iVar1) {
    local_28 = QWheelEvent::angleDelta
                         ((QWheelEvent *)
                          CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    iVar1 = QPoint::x((QPoint *)0x878b6c);
    bVar9 = false;
    if ((iVar1 == 0) &&
       (((pQVar7->flow == TopToBottom && ((pQVar7->wrap & 1U) != 0)) ||
        ((bVar9 = false, pQVar7->flow == LeftToRight && (bVar9 = false, (pQVar7->wrap & 1U) == 0))))
       )) {
      iVar1 = QAbstractSlider::minimum
                        ((QAbstractSlider *)
                         CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      bVar9 = false;
      if (iVar1 == 0) {
        iVar1 = QAbstractSlider::maximum
                          ((QAbstractSlider *)
                           CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        bVar9 = iVar1 == 0;
      }
    }
    if (bVar9) {
      local_30 = (QPoint *)&DAT_aaaaaaaaaaaaaaaa;
      local_38 = QWheelEvent::pixelDelta
                           ((QWheelEvent *)
                            CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      QPoint::y((QPoint *)0x878c31);
      local_40 = QWheelEvent::pixelDelta
                           ((QWheelEvent *)
                            CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      QPoint::x((QPoint *)0x878c54);
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
      local_48 = (QPoint *)&DAT_aaaaaaaaaaaaaaaa;
      local_50 = QWheelEvent::angleDelta
                           ((QWheelEvent *)
                            CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      QPoint::y((QPoint *)0x878c95);
      local_58 = QWheelEvent::angleDelta
                           ((QWheelEvent *)
                            CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      QPoint::x((QPoint *)0x878cb8);
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
      memset(local_b8,0xaa,0x60);
      local_c8 = QSinglePointEvent::position((QSinglePointEvent *)0x878cec);
      local_d8 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x878d08);
      local_e0 = local_30;
      local_e8 = local_48;
      MVar3 = QSinglePointEvent::buttons
                        ((QSinglePointEvent *)
                         CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      QVar4.i = (Int)QInputEvent::modifiers
                               ((QInputEvent *)
                                CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      SVar5 = QWheelEvent::phase(in_RSI);
      bVar9 = QWheelEvent::inverted(in_RSI);
      MVar6 = QWheelEvent::source(in_RSI);
      QString::QString((QString *)0x878d8a);
      pQVar8 = (QPointingDevice *)QPointingDevice::primaryPointingDevice((QString *)local_100);
      QWheelEvent::QWheelEvent
                (local_b8,(QPointF *)&local_c8,(QPointF *)&local_d8,local_e0,local_e8,
                 (QFlags_conflict1 *)
                 (ulong)(uint)MVar3.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                              super_QFlagsStorage<Qt::MouseButton>.i,
                 (QFlags_conflict1 *)CONCAT44(in_stack_fffffffffffffe9c,QVar4.i),SVar5,bVar9,MVar6,
                 pQVar8);
      QString::~QString((QString *)0x878dfd);
      bVar9 = QEvent::spontaneous((QEvent *)in_RSI);
      if (bVar9) {
        qt_sendSpontaneousEvent
                  ((QObject *)CONCAT44(in_stack_fffffffffffffea4,SVar5),
                   (QEvent *)CONCAT44(in_stack_fffffffffffffe9c,QVar4.i));
      }
      else {
        QCoreApplication::sendEvent
                  ((QObject *)
                   (pQVar7->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar,
                   (QEvent *)local_b8);
      }
      bVar9 = QEvent::isAccepted((QEvent *)local_b8);
      (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar9);
      QWheelEvent::~QWheelEvent(local_b8);
    }
    else {
      QCoreApplication::sendEvent
                ((QObject *)
                 (pQVar7->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar,
                 (QEvent *)in_RSI);
    }
  }
  else {
    QCoreApplication::sendEvent
              ((QObject *)
               (pQVar7->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar,
               (QEvent *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::wheelEvent(QWheelEvent *e)
{
    Q_D(QListView);
    if (qAbs(e->angleDelta().y()) > qAbs(e->angleDelta().x())) {
        if (e->angleDelta().x() == 0
                && ((d->flow == TopToBottom && d->wrap) || (d->flow == LeftToRight && !d->wrap))
                && d->vbar->minimum() == 0 && d->vbar->maximum() == 0) {
            QPoint pixelDelta(e->pixelDelta().y(), e->pixelDelta().x());
            QPoint angleDelta(e->angleDelta().y(), e->angleDelta().x());
            QWheelEvent hwe(e->position(), e->globalPosition(), pixelDelta, angleDelta,
                            e->buttons(), e->modifiers(), e->phase(), e->inverted(), e->source());
            if (e->spontaneous())
                qt_sendSpontaneousEvent(d->hbar, &hwe);
            else
                QCoreApplication::sendEvent(d->hbar, &hwe);
            e->setAccepted(hwe.isAccepted());
        } else {
            QCoreApplication::sendEvent(d->vbar, e);
        }
    } else {
        QCoreApplication::sendEvent(d->hbar, e);
    }
}